

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O1

SQInteger __thiscall
SQTable::Next(SQTable *this,bool getweakrefs,SQObjectPtr *refpos,SQObjectPtr *outkey,
             SQObjectPtr *outval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQFloat SVar4;
  SQUnsignedInteger SVar5;
  SQObjectValue *pSVar6;
  
  SVar5 = TranslateIndex(refpos);
  if ((long)SVar5 < this->_numofnodes) {
    pSVar6 = &this->_nodes[SVar5].key.super_SQObject._unVal;
    do {
      SVar5 = SVar5 + 1;
      if (pSVar6[-1].fFloat != 2.350989e-38) {
        SVar2 = (outkey->super_SQObject)._type;
        pSVar3 = (outkey->super_SQObject)._unVal.pTable;
        (outkey->super_SQObject)._unVal = *pSVar6;
        SVar4 = pSVar6[-1].fFloat;
        (outkey->super_SQObject)._type = (SQObjectType)SVar4;
        if (((uint)SVar4 >> 0x1b & 1) != 0) {
          pSVar1 = &(((outkey->super_SQObject)._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        SVar4 = pSVar6[-3].fFloat;
        pSVar6 = pSVar6 + -2;
        if ((!getweakrefs) && (SVar4 == 3.8819525e-34)) {
          SVar4 = (SQFloat)(pSVar6->pWeakRef->_obj)._type;
          pSVar6 = &(pSVar6->pWeakRef->_obj)._unVal;
        }
        SVar2 = (outval->super_SQObject)._type;
        pSVar3 = (outval->super_SQObject)._unVal.pTable;
        (outval->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)*(SQWeakRef **)pSVar6;
        (outval->super_SQObject)._type = (SQObjectType)SVar4;
        if (((uint)SVar4 >> 0x1b & 1) != 0) {
          pSVar1 = &(((outval->super_SQObject)._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) == 0) {
          return SVar5;
        }
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 != 0) {
          return SVar5;
        }
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
        return SVar5;
      }
      pSVar6 = pSVar6 + 5;
    } while (SVar5 != this->_numofnodes);
  }
  return -1;
}

Assistant:

SQInteger SQTable::Next(bool getweakrefs,const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQInteger idx = (SQInteger)TranslateIndex(refpos);
    while (idx < _numofnodes) {
        if(type(_nodes[idx].key) != OT_NULL) {
            //first found
            _HashNode &n = _nodes[idx];
            outkey = n.key;
            outval = getweakrefs?(SQObject)n.val:_realval(n.val);
            //return idx for the next iteration
            return ++idx;
        }
        ++idx;
    }
    //nothing to iterate anymore
    return -1;
}